

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  jpeg_d_main_controller *pjVar1;
  int iVar2;
  uint in_ECX;
  JDIMENSION *in_RDX;
  JSAMPARRAY in_RSI;
  j_decompress_ptr in_RDI;
  my_main_ptr_conflict main_ptr;
  
  pjVar1 = in_RDI->main;
  if (*(int *)&pjVar1[6].start_pass == 0) {
    iVar2 = (*in_RDI->coef->decompress_data)
                      (in_RDI,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data]
                      );
    if (iVar2 == 0) {
      return;
    }
    *(undefined4 *)&pjVar1[6].start_pass = 1;
    *(int *)((long)&pjVar1[8].start_pass + 4) = *(int *)((long)&pjVar1[8].start_pass + 4) + 1;
  }
  iVar2 = *(int *)((long)&pjVar1[7].process_data + 4);
  if (iVar2 != 0) {
    if (iVar2 == 1) goto LAB_0018c7b9;
    if (iVar2 != 2) {
      return;
    }
    (*in_RDI->post->post_process_data)
              (in_RDI,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data],
               (JDIMENSION *)((long)&pjVar1[6].start_pass + 4),*(JDIMENSION *)&pjVar1[8].start_pass,
               in_RSI,in_RDX,in_ECX);
    if (*(uint *)((long)&pjVar1[6].start_pass + 4) < *(uint *)&pjVar1[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 0;
    if (in_ECX <= *in_RDX) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
  *(int *)&pjVar1[8].start_pass = in_RDI->min_DCT_scaled_size + -1;
  if (*(JDIMENSION *)((long)&pjVar1[8].start_pass + 4) == in_RDI->total_iMCU_rows) {
    set_bottom_pointers(in_RDI);
  }
  *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 1;
LAB_0018c7b9:
  (*in_RDI->post->post_process_data)
            (in_RDI,(JSAMPIMAGE)(&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data],
             (JDIMENSION *)((long)&pjVar1[6].start_pass + 4),*(JDIMENSION *)&pjVar1[8].start_pass,
             in_RSI,in_RDX,in_ECX);
  if (*(uint *)&pjVar1[8].start_pass <= *(uint *)((long)&pjVar1[6].start_pass + 4)) {
    if (*(int *)((long)&pjVar1[8].start_pass + 4) == 1) {
      set_wraparound_pointers(in_RDI);
    }
    *(uint *)&pjVar1[7].process_data = *(uint *)&pjVar1[7].process_data ^ 1;
    *(undefined4 *)&pjVar1[6].start_pass = 0;
    *(int *)((long)&pjVar1[6].start_pass + 4) = in_RDI->min_DCT_scaled_size + 1;
    *(int *)&pjVar1[8].start_pass = in_RDI->min_DCT_scaled_size + 2;
    *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main(j_decompress_ptr cinfo, JSAMPARRAY output_buf,
                          JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (!main_ptr->buffer_full) {
    if (!(*cinfo->coef->decompress_data) (cinfo,
                                          main_ptr->xbuffer[main_ptr->whichptr]))
      return;                   /* suspension forced, can do nothing more */
    main_ptr->buffer_full = TRUE;       /* OK, we have an iMCU row to work with */
    main_ptr->iMCU_row_ctr++;   /* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main_ptr->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo,
                                       main_ptr->xbuffer[main_ptr->whichptr],
                                       &main_ptr->rowgroup_ctr,
                                       main_ptr->rowgroups_avail, output_buf,
                                       out_row_ctr, out_rows_avail);
    if (main_ptr->rowgroup_ctr < main_ptr->rowgroups_avail)
      return;                   /* Need to suspend */
    main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;                   /* Postprocessor exactly filled output buf */
    FALLTHROUGH                 /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main_ptr->rowgroup_ctr = 0;
    main_ptr->rowgroups_avail = (JDIMENSION)(cinfo->_min_DCT_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main_ptr->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main_ptr->context_state = CTX_PROCESS_IMCU;
    FALLTHROUGH                 /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo,
                                       main_ptr->xbuffer[main_ptr->whichptr],
                                       &main_ptr->rowgroup_ctr,
                                       main_ptr->rowgroups_avail, output_buf,
                                       out_row_ctr, out_rows_avail);
    if (main_ptr->rowgroup_ctr < main_ptr->rowgroups_avail)
      return;                   /* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main_ptr->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main_ptr->whichptr ^= 1;    /* 0=>1 or 1=>0 */
    main_ptr->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main_ptr->rowgroup_ctr = (JDIMENSION)(cinfo->_min_DCT_scaled_size + 1);
    main_ptr->rowgroups_avail = (JDIMENSION)(cinfo->_min_DCT_scaled_size + 2);
    main_ptr->context_state = CTX_POSTPONED_ROW;
  }
}